

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O2

void __thiscall
oqpi::local_sync_object<oqpi::posix_semaphore>::local_sync_object<int&,int&>
          (local_sync_object<oqpi::posix_semaphore> *this,int *args,int *args_1)

{
  int32_t initCount;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  initCount = *args;
  (this->super_posix_semaphore).maxCount_ = *args_1;
  posix_semaphore_wrapper::posix_semaphore_wrapper
            (&(this->super_posix_semaphore).sem_,&local_40,open_or_create,initCount);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

local_sync_object(_Args &&...args)
            : _Impl("", sync_object_creation_options::open_or_create, std::forward<_Args>(args)...)
        {}